

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O3

void __thiscall
QDirListing::QDirListing
          (QDirListing *this,QString *path,QStringList *nameFilters,uint qdirFilters,
          uint qdirIteratorFlags)

{
  uint uVar1;
  qsizetype qVar2;
  QArrayData *data;
  char *pcVar3;
  qsizetype qVar4;
  QArrayData *pQVar5;
  char16_t *pcVar6;
  QDirListingPrivate *pQVar7;
  long in_FS_OFFSET;
  QFileSystemEntry local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = (QDirListingPrivate *)operator_new(0x800);
  QDirListingPrivate::QDirListingPrivate(pQVar7);
  this->d = pQVar7;
  QFileSystemEntry::QFileSystemEntry(&local_78,path);
  pQVar7 = this->d;
  pQVar5 = &((pQVar7->initialEntryInfo).entry.m_filePath.d.d)->super_QArrayData;
  pcVar6 = (pQVar7->initialEntryInfo).entry.m_filePath.d.ptr;
  (pQVar7->initialEntryInfo).entry.m_filePath.d.d = local_78.m_filePath.d.d;
  (pQVar7->initialEntryInfo).entry.m_filePath.d.ptr = local_78.m_filePath.d.ptr;
  qVar2 = (pQVar7->initialEntryInfo).entry.m_filePath.d.size;
  (pQVar7->initialEntryInfo).entry.m_filePath.d.size = local_78.m_filePath.d.size;
  data = &((pQVar7->initialEntryInfo).entry.m_nativeFilePath.d.d)->super_QArrayData;
  (pQVar7->initialEntryInfo).entry.m_nativeFilePath.d.d = local_78.m_nativeFilePath.d.d;
  pcVar3 = (pQVar7->initialEntryInfo).entry.m_nativeFilePath.d.ptr;
  (pQVar7->initialEntryInfo).entry.m_nativeFilePath.d.ptr = local_78.m_nativeFilePath.d.ptr;
  qVar4 = (pQVar7->initialEntryInfo).entry.m_nativeFilePath.d.size;
  (pQVar7->initialEntryInfo).entry.m_nativeFilePath.d.size = local_78.m_nativeFilePath.d.size;
  (pQVar7->initialEntryInfo).entry.m_lastDotInFileName = local_78.m_lastDotInFileName;
  (pQVar7->initialEntryInfo).entry.m_lastSeparator = local_78.m_lastSeparator;
  (pQVar7->initialEntryInfo).entry.m_firstDotInFileName = local_78.m_firstDotInFileName;
  local_78.m_filePath.d.d = (Data *)pQVar5;
  local_78.m_filePath.d.ptr = pcVar6;
  local_78.m_filePath.d.size = qVar2;
  local_78.m_nativeFilePath.d.d = (Data *)data;
  local_78.m_nativeFilePath.d.ptr = pcVar3;
  local_78.m_nativeFilePath.d.size = qVar4;
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,1,0x10);
    }
  }
  if (&(local_78.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_78.m_filePath.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::operator=(&(this->d->nameFilters).d,&nameFilters->d);
  pQVar7 = this->d;
  pQVar7->useLegacyFilters = true;
  (pQVar7->legacyDirFilters).super_QFlagsStorageHelper<QDir::Filter,_4>.
  super_QFlagsStorage<QDir::Filter>.i = qdirFilters;
  uVar1 = (uint)(ushort)(((ushort)qdirIteratorFlags & 3) << 8) * 0x40;
  (pQVar7->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
  super_QFlagsStorage<QDirListing::IteratorFlag>.i =
       (uVar1 >> 1 & 0x5550) + (uVar1 & 0x5550) * 2 >> 4;
  QDirListingPrivate::init(this->d,(EVP_PKEY_CTX *)0x1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDirListing::QDirListing(const QString &path, const QStringList &nameFilters, uint qdirFilters,
                         uint qdirIteratorFlags)
    : d(new QDirListingPrivate)
{
    d->initialEntryInfo.entry = QFileSystemEntry(path);
    d->nameFilters = nameFilters;
    d->setLegacyFilters(QDir::Filters::fromInt(qdirFilters),
                        QDirIterator::IteratorFlags::fromInt(qdirIteratorFlags));
    d->init();
}